

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O3

bool __thiscall
gl4cts::UncommittedRegionsAccessTestCase::UncommittedDepthStencil
          (UncommittedRegionsAccessTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level)

{
  undefined1 *this_00;
  _Alloc_hider _Var1;
  bool bVar2;
  bool bVar3;
  GLenum GVar4;
  ostream *poVar5;
  size_t sVar6;
  int iVar7;
  long lVar8;
  GLint height;
  GLint width;
  GLint depth;
  string fragmentSource;
  string vertexSource;
  ShaderProgram program;
  ProgramSources sources;
  int local_21c;
  int local_218;
  int local_214;
  value_type local_210;
  value_type local_1f0;
  ShaderProgram local_1d0;
  ProgramSources local_100;
  
  bVar2 = true;
  if (format == 0x8058 && target == 0xde1) {
    this_00 = &(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
               field_0x88;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Depth Stencil - ",0x10);
    SparseTextureUtils::getTextureLevelSize
              (0xde1,&(this->super_SparseTexture2CommitmentTestCase).
                      super_SparseTextureCommitmentTestCase.mState,level,&local_218,&local_21c,
               &local_214);
    iVar7 = local_218;
    bVar2 = true;
    if (((2 < local_218 + 1U) && (local_21c != 0)) &&
       ((this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.mState.
        minDepth <= local_214)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f0,st2_vertex_drawBuffer,(allocator<char> *)&local_1d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,st2_fragment_drawBuffer,(allocator<char> *)&local_1d0);
      memset(&local_100,0,0xac);
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      local_100._193_8_ = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_100.sources,&local_1f0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_100.sources + 1,&local_210);
      glu::ShaderProgram::ShaderProgram(&local_1d0,gl,&local_100);
      iVar7 = iVar7 / 2;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_100.transformFeedbackVaryings);
      std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
                (&local_100.attribLocationBindings);
      lVar8 = 0x78;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&local_100.sources[0].
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar8));
        lVar8 = lVar8 + -0x18;
      } while (lVar8 != -0x18);
      if (local_1d0.m_program.m_info.linkOk == false) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"Shader compilation failed (depth_stencil) for target: ",0x36)
        ;
        poVar5 = (ostream *)std::ostream::operator<<(this_00,0xde1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", format: ",10);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x8058);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", vertex_infoLog: ",0x12);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,((*local_1d0.m_shaders[0].
                                      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->m_info).infoLog.
                                   _M_dataplus._M_p,
                            ((*local_1d0.m_shaders[0].
                               super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                               _M_impl.super__Vector_impl_data._M_start)->m_info).infoLog.
                            _M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", fragment_infoLog: ",0x14);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,((*local_1d0.m_shaders[1].
                                      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->m_info).infoLog.
                                   _M_dataplus._M_p,
                            ((*local_1d0.m_shaders[1].
                               super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                               _M_impl.super__Vector_impl_data._M_start)->m_info).infoLog.
                            _M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", vertexSource: ",0x10);
        _Var1._M_p = local_1f0._M_dataplus._M_p;
        if (local_1f0._M_dataplus._M_p == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
        }
        else {
          sVar6 = strlen(local_1f0._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,_Var1._M_p,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", fragmentSource: ",0x12);
        _Var1._M_p = local_210._M_dataplus._M_p;
        if (local_210._M_dataplus._M_p == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
        }
        else {
          sVar6 = strlen(local_210._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,_Var1._M_p,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," - ",3);
        bVar2 = false;
      }
      else {
        prepareDepthStencilFramebuffer(this,gl,local_218,local_21c);
        (*gl->useProgram)(local_1d0.m_program.m_program);
        (*gl->activeTexture)(0x84c0);
        GVar4 = (*gl->getError)();
        glu::checkError(GVar4,"glActiveTexture",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x621);
        gl4cts::Texture::Bind(gl,*texture,0xde1);
        (*gl->uniform1i)(1,0);
        GVar4 = (*gl->getError)();
        glu::checkError(GVar4,"glUniform1i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x624);
        bVar2 = verifyStencilTest(this,gl,&local_1d0,local_218,local_21c,iVar7);
        if (bVar2) {
          bVar2 = verifyDepthTest(this,gl,&local_1d0,local_218,local_21c,iVar7);
        }
        else {
          bVar2 = false;
        }
        bVar3 = glu::ContextInfo::isExtensionSupported
                          (((this->super_SparseTexture2CommitmentTestCase).
                            super_SparseTextureCommitmentTestCase.super_TestCase.m_context)->
                           m_contextInfo,"GL_EXT_depth_bounds_test");
        if ((bVar2 & bVar3) == 1) {
          bVar2 = verifyDepthBoundsTest(this,gl,&local_1d0,local_218,local_21c,iVar7);
        }
        else {
          bVar2 = (bool)(bVar2 & !bVar3);
        }
        cleanupDepthStencilFramebuffer(this,gl);
      }
      glu::ShaderProgram::~ShaderProgram(&local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return bVar2;
}

Assistant:

bool UncommittedRegionsAccessTestCase::depthStencilAllowed(GLint target, GLint format)
{
	if (target == GL_TEXTURE_2D && format == GL_RGBA8)
	{
		return true;
	}

	return false;
}